

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O1

void __thiscall
Profile::applyProfiling
          (Profile *this,vector<void_*,_std::allocator<void_*>_> *btVec,string *label,
          ShadowValue *sv)

{
  unordered_map<unsigned_long,_std::shared_ptr<DynFuncCall>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  Profile *pPVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  uintptr_t dynHashKey;
  string staticHashKey;
  statHashKey_t shk;
  undefined1 local_e9;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  _Hash_node_base *local_d0;
  DynFuncCall *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_c0 [2];
  key_type local_b0;
  vector<void_*,_std::allocator<void_*>_> local_90;
  statHashKey_t local_78;
  void *local_48 [3];
  
  pPVar11 = (Profile *)local_48;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_48,btVec);
  local_d0 = (_Hash_node_base *)
             __dynHashKey(pPVar11,(vector<void_*,_std::allocator<void_*>_> *)local_48);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0]);
  }
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = (this->__backtraceDynamicMap)._M_h._M_bucket_count;
  uVar10 = (ulong)local_d0 % uVar2;
  p_Var12 = (this->__backtraceDynamicMap)._M_h._M_buckets[uVar10];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var12->_M_nxt, p_Var13 = p_Var12, local_d0 != p_Var12->_M_nxt[1]._M_nxt)) {
    while (p_Var12 = p_Var3, p_Var3 = p_Var12->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar10) ||
         (p_Var13 = p_Var12, local_d0 == p_Var3[1]._M_nxt)) goto LAB_00141c48;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_00141c48:
  this_00 = &this->__backtraceDynamicMap;
  if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
    pPVar11 = (Profile *)btVec;
    std::vector<void_*,_std::allocator<void_*>_>::vector(&local_90,btVec);
    __staticHashKey(&local_78,pPVar11,&local_90);
    if (local_90.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_78.hashKey._M_dataplus._M_p,
               local_78.hashKey._M_dataplus._M_p + local_78.hashKey._M_string_length);
    this_01 = &this->__backtraceStaticMap;
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
            ::find(&this_01->_M_t,&local_b0);
    p_Var1 = &(this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
      local_c8 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<DynFuncCall,std::allocator<DynFuncCall>,std::vector<void*,std::allocator<void*>>&,unsigned_long&>
                (a_Stack_c0,&local_c8,(allocator<DynFuncCall> *)&local_e9,btVec,
                 (unsigned_long *)&local_d0);
      _Var4._M_pi = a_Stack_c0[0]._M_pi;
      local_e8 = local_c8;
      this_02._M_pi = a_Stack_e0[0]._M_pi;
      local_c8 = (DynFuncCall *)0x0;
      a_Stack_c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      a_Stack_e0[0]._M_pi = _Var4._M_pi;
      if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
      }
      if (a_Stack_c0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_c0[0]._M_pi);
      }
      pmVar7 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_d0);
      (pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 a_Stack_e0);
      DynFuncCall::updateBtSymbols(local_e8,&local_78);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
              ::find(&this_01->_M_t,&local_b0);
      if (p_Var1 != (_Rb_tree_header *)iVar8._M_node) {
        __assert_fail("__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xf4,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
               ::operator[](this_01,&local_b0);
      (pmVar9->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar9->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 a_Stack_e0);
      this->__totalCallStacks = this->__totalCallStacks + 1;
      if ((DebugFlag == true) && (bVar5 = isCurrentDebugType("total"), bVar5)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"applyProfiling",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,0xf7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Total Call Stack ",0x12);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
    }
    else {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DynFuncCall>_>_>_>
               ::operator[](this_01,&local_b0);
      local_e8 = (pmVar9->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_e0,
                 &(pmVar9->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
      ;
      if (local_e8 == (element_type *)0x0) {
        __assert_fail("dfc",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/internal/src/Profile.cpp"
                      ,0xee,"void Profile::applyProfiling(vector<void *> &, string, ShadowValue &)")
        ;
      }
      pmVar7 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_d0);
      (pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_e8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 a_Stack_e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.hashKey._M_dataplus._M_p != &local_78.hashKey.field_2) {
      operator_delete(local_78.hashKey._M_dataplus._M_p);
    }
  }
  else {
    if ((DebugFlag == true) && (bVar5 = isCurrentDebugType("total"), bVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"applyProfiling",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,0xfb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," Elt already in Dynamic Hash Map ",0x21);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    pmVar7 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<DynFuncCall>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_d0);
    local_e8 = (pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (a_Stack_e0,
               &(pmVar7->super___shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  }
  DynFuncCall::applyProfiling(local_e8,sv);
  this->__totalDynCount = this->__totalDynCount + 1;
  if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
  }
  return;
}

Assistant:

void Profile::applyProfiling(vector<void*> & btVec, string label, ShadowValue &sv){
#ifndef USE_LABEL
    //TODO: more efficient to change hashMap with key string?
    uintptr_t dynHashKey = __dynHashKey(btVec);
    UNUSED(label);
#else
    uintptr_t dynHashKey = hashLabel(label);
#endif
    shared_ptr<DynFuncCall> dfc(nullptr);
    auto dynHashKeyIte = __backtraceDynamicMap.find(dynHashKey);
    /* Can not find the element in Dynamic Hash Map */
    if(dynHashKeyIte == __backtraceDynamicMap.end()) {
        /* Update Static HashMap */
#ifndef USE_LABEL
        struct statHashKey_t shk = __staticHashKey(btVec);
        string staticHashKey = shk.hashKey;
#else
        string staticHashKey = label;
#endif
        auto statHashKeyIte = __backtraceStaticMap.find(staticHashKey);
        /* Element can still be in Static backtrace map
         * Indeed: 2 ASLR sensitive backtraces may correspond to
         * the same dladdr based backtrace(the missing index bug!).
         * */
        if(statHashKeyIte != __backtraceStaticMap.end()) {
            dfc = __backtraceStaticMap[staticHashKey];
            assert(dfc);
            __backtraceDynamicMap[dynHashKey] = dfc;
        }else{
            dfc = make_shared<DynFuncCall>(btVec, dynHashKey);
            __backtraceDynamicMap[dynHashKey] = dfc;
            dfc->updateBtSymbols(shk);
            assert(__backtraceStaticMap.end() == __backtraceStaticMap.find(staticHashKey));
            __backtraceStaticMap[staticHashKey] = dfc;
            __totalCallStacks += 1;
            DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Total Call Stack " << __totalCallStacks <<endl;);
        }
    }else{
        // The element is in Dynamic Hash Map
        DEBUG("total",cerr << __FUNCTION__ << ":" << __LINE__<< " Elt already in Dynamic Hash Map " << __totalCallStacks <<endl;);
        dfc = __backtraceDynamicMap[dynHashKey];
    }
    dfc->applyProfiling(sv);
    __totalDynCount++;
}